

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mustach.c
# Opt level: O1

int memfile_close(FILE *file,char **buffer,size_t *size)

{
  long lVar1;
  int iVar2;
  size_t __size;
  char *__ptr;
  size_t sVar3;
  int *piVar4;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  __size = ftell((FILE *)file);
  __ptr = (char *)malloc(__size + 1);
  if (__ptr == (char *)0x0) {
    piVar4 = __errno_location();
    *piVar4 = 0xc;
  }
  else {
    rewind((FILE *)file);
    sVar3 = fread(__ptr,__size,1,(FILE *)file);
    if (sVar3 == 1) {
      __ptr[__size] = '\0';
      iVar2 = 0;
      goto LAB_0010555a;
    }
    free(__ptr);
  }
  iVar2 = -1;
  __size = 0;
  __ptr = (char *)0x0;
LAB_0010555a:
  *buffer = __ptr;
  *size = __size;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return iVar2;
  }
  __stack_chk_fail();
}

Assistant:

static int memfile_close(FILE *file, char **buffer, size_t *size)
{
	int rc;
	size_t s;
	char *b;

	s = (size_t)ftell(file);
	b = malloc(s + 1);
	if (b == NULL) {
		rc = MUSTACH_ERROR_SYSTEM;
		errno = ENOMEM;
		s = 0;
	} else {
		rewind(file);
		if (1 == fread(b, s, 1, file)) {
			rc = 0;
			b[s] = 0;
		} else {
			rc = MUSTACH_ERROR_SYSTEM;
			free(b);
			b = NULL;
			s = 0;
		}
	}
	*buffer = b;
	*size = s;
	return rc;
}